

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

int struct_size_IOfield(FMContext fmc,FMFieldList list)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  FMFieldList p_Var4;
  long elements;
  int local_30 [2];
  
  if (list->field_name == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    p_Var4 = list + 1;
    iVar3 = 0;
    do {
      iVar2 = is_all_static_array_dimens(p_Var4[-1].field_type);
      if (iVar2 == 0) {
        if (fmc == (FMContext)0x0) {
          iVar2 = 8;
        }
        else {
          iVar2 = fmc->native_pointer_size;
          if (iVar2 == 0) {
            iVar2 = 8;
          }
        }
      }
      else if (fmc == (FMContext)0x0) {
        iVar2 = p_Var4[-1].field_size;
      }
      else {
        FMarray_str_to_data_type(p_Var4[-1].field_type,(long *)local_30);
        iVar2 = p_Var4[-1].field_size * local_30[0];
      }
      iVar2 = iVar2 + p_Var4[-1].field_offset;
      if (iVar3 <= iVar2) {
        iVar3 = iVar2;
      }
      ppcVar1 = &p_Var4->field_name;
      p_Var4 = p_Var4 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  return iVar3;
}

Assistant:

extern
int
struct_size_IOfield(FMContext fmc, FMFieldList list)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is fmformat->pointer_size */
	    if ((fmc == NULL) || (fmc->native_pointer_size == 0)) {
		field_size = sizeof(char *);
	    } else {
		field_size = fmc->native_pointer_size;
	    }
	} else {
	    if (fmc) {
		long elements;
		FMarray_str_to_data_type(list[i].field_type, &elements);
		field_size = list[i].field_size * elements;
	    } else {
		field_size = list[i].field_size;
	    }
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
	i++;
    }
    return struct_size;
}